

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BufferReader.hh
# Opt level: O3

ssize_t __thiscall avro::BufferReader::read(BufferReader *this,int __fd,void *__buf,size_t __nbytes)

{
  _Elt_pointer pCVar1;
  data_type *pdVar2;
  undefined4 in_register_00000034;
  data_type *__src;
  data_type *pdVar3;
  data_type *__dest;
  
  __dest = (data_type *)CONCAT44(in_register_00000034,__fd);
  pdVar3 = (data_type *)this->bytesRemaining_;
  pdVar2 = (data_type *)__buf;
  if (pdVar3 < __buf) {
    __buf = pdVar3;
    pdVar2 = pdVar3;
  }
  for (; (data_type *)__buf != (data_type *)0x0; __buf = (data_type *)((long)__buf + -(long)pdVar3))
  {
    pCVar1 = (this->iter_)._M_cur;
    __src = pCVar1->readPos_ + this->chunkPos_;
    pdVar3 = pCVar1->writePos_ + -(long)__src;
    if (__buf <= pdVar3) {
      pdVar3 = (data_type *)__buf;
    }
    memcpy(__dest,__src,(size_t)pdVar3);
    __dest = __dest + (long)pdVar3;
    incrementChunk(this,(size_type)pdVar3);
  }
  return (ssize_t)pdVar2;
}

Assistant:

size_type read(data_type *data, size_type size) { 

        if(size > bytesRemaining_) {
            size = bytesRemaining_;
        }
        size_type sizeToRead = size;

        while(sizeToRead) {
            const size_type toRead = std::min(sizeToRead, chunkRemaining());
            memcpy(data, addr(), toRead);
            sizeToRead -= toRead;
            data += toRead;
            incrementChunk(toRead);
        }

        return size;
    }